

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O2

void evutil_found_ifaddr(sockaddr *sa)

{
  int iVar1;
  undefined1 *puVar2;
  char *fmt;
  
  if (sa->sa_family == 10) {
    iVar1 = evutil_v6addr_is_local_((in6_addr *)(sa->sa_data + 6));
    if (iVar1 != 0) {
      return;
    }
    puVar2 = &had_ipv6_address;
    if (event_debug_logging_mask_ == 0) goto LAB_001cba68;
    fmt = "Detected an IPv6 interface";
  }
  else {
    if (sa->sa_family != 2) {
      return;
    }
    iVar1 = evutil_v4addr_is_local_((in_addr *)(sa->sa_data + 2));
    if (iVar1 != 0) {
      return;
    }
    puVar2 = &had_ipv4_address;
    if (event_debug_logging_mask_ == 0) goto LAB_001cba68;
    fmt = "Detected an IPv4 interface";
  }
  event_debugx_(fmt);
LAB_001cba68:
  *puVar2 = 1;
  return;
}

Assistant:

static void
evutil_found_ifaddr(const struct sockaddr *sa)
{
	if (sa->sa_family == AF_INET) {
		const struct sockaddr_in *sin = (struct sockaddr_in *)sa;
		if (!evutil_v4addr_is_local_(&sin->sin_addr)) {
			event_debug(("Detected an IPv4 interface"));
			had_ipv4_address = 1;
		}
	} else if (sa->sa_family == AF_INET6) {
		const struct sockaddr_in6 *sin6 = (struct sockaddr_in6 *)sa;
		if (!evutil_v6addr_is_local_(&sin6->sin6_addr)) {
			event_debug(("Detected an IPv6 interface"));
			had_ipv6_address = 1;
		}
	}
}